

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void duckdb::FetchCommittedRangeValidity
               (UpdateInfo *info,idx_t start,idx_t end,idx_t result_offset,Vector *result)

{
  ulong *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  bool bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  buffer_ptr<ValidityBuffer> *local_58;
  long local_50;
  long local_48;
  idx_t local_40;
  idx_t local_38;
  
  local_40 = end;
  FlatVector::VerifyFlatVector(result);
  if (info->N != 0) {
    lVar10 = (long)&info[1].segment + (ulong)info->max * 4;
    lVar9 = result_offset - start;
    local_58 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar11 = 0;
    local_50 = lVar10;
    local_48 = lVar9;
    do {
      uVar8 = (ulong)*(uint *)((long)&info[1].segment + uVar11 * 4);
      bVar4 = false;
      if ((start <= uVar8) && (bVar4 = true, uVar8 < local_40)) {
        uVar8 = uVar8 + lVar9;
        puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (*(char *)(lVar10 + uVar11) == '\x01') {
          bVar4 = false;
          if (puVar2 != (unsigned_long *)0x0) {
            puVar2[uVar8 >> 6] = puVar2[uVar8 >> 6] | 1L << ((byte)uVar8 & 0x3f);
          }
        }
        else {
          if (puVar2 == (unsigned_long *)0x0) {
            local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_68,&local_38);
            p_Var6 = p_Stack_60;
            peVar5 = local_68;
            local_68 = (element_type *)0x0;
            p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar5;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var6;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
            }
            pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (local_58);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar7->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            lVar9 = local_48;
            lVar10 = local_50;
          }
          bVar3 = (byte)uVar8 & 0x3f;
          puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar8 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
          bVar4 = false;
        }
      }
    } while ((!bVar4) && (uVar11 = uVar11 + 1, uVar11 < info->N));
  }
  return;
}

Assistant:

static void FetchCommittedRangeValidity(UpdateInfo &info, idx_t start, idx_t end, idx_t result_offset, Vector &result) {
	auto &result_mask = FlatVector::Validity(result);
	MergeUpdateInfoRangeValidity(info, start, end, result_offset, result_mask);
}